

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int lyp_check_identifier(ly_ctx *ctx,char *id,LY_IDENT type,lys_module *module,lys_node *parent)

{
  char cVar1;
  byte bVar2;
  LYS_NODE LVar3;
  lys_node *plVar4;
  lys_submodule *plVar5;
  lys_module *module_00;
  long lVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  lys_module *plVar10;
  uint size;
  LY_ECODE ecode;
  char *pcVar11;
  char *pcVar12;
  lys_node **pplVar13;
  
  if ((ctx == (ly_ctx *)0x0) || (id == (char *)0x0)) {
    __assert_fail("ctx && id",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
                  ,0x8e7,
                  "int lyp_check_identifier(struct ly_ctx *, const char *, enum LY_IDENT, struct lys_module *, struct lys_node *)"
                 );
  }
  cVar1 = *id;
  if (((byte)(cVar1 + 0xbfU) < 0x1a) || (cVar1 == '_' || (byte)(cVar1 + 0x9fU) < 0x1a)) {
    uVar8 = 1;
    while( true ) {
      bVar2 = id[uVar8];
      if (bVar2 == 0) break;
      if (((9 < (byte)(bVar2 - 0x30)) && (0x19 < (byte)((bVar2 & 0xdf) + 0xbf))) &&
         ((0x32 < bVar2 - 0x2d || ((0x4000000000003U >> ((ulong)(bVar2 - 0x2d) & 0x3f) & 1) == 0))))
      {
        pcVar12 = "invalid character";
        goto LAB_00125ac7;
      }
      uVar8 = uVar8 + 1;
    }
    if (0x40 < uVar8) {
      ly_log(ctx,LY_LLWRN,LY_SUCCESS,"Identifier \"%s\" is long, you should use something shorter.")
      ;
    }
    iVar7 = 0;
    switch(type) {
    case LY_IDENT_FEATURE:
      if (module == (lys_module *)0x0) {
        __assert_fail("module",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
                      ,0x94d,
                      "int lyp_check_identifier(struct ly_ctx *, const char *, enum LY_IDENT, struct lys_module *, struct lys_node *)"
                     );
      }
      plVar10 = lys_main_module(module);
      iVar7 = dup_feature_check(id,module);
      if (iVar7 == 0) {
        bVar2 = plVar10->inc_size;
        lVar9 = 0;
        do {
          if ((ulong)bVar2 * 0x30 + 0x30 == lVar9 + 0x30) {
            return 0;
          }
          module_00 = *(lys_module **)(plVar10->inc->rev + lVar9 + -8);
          if (module_00 == (lys_module *)0x0) {
            return 0;
          }
          iVar7 = dup_feature_check(id,module_00);
          lVar9 = lVar9 + 0x30;
        } while (iVar7 == 0);
        pcVar11 = "feature";
      }
      else {
        pcVar11 = "feature";
      }
      break;
    default:
      goto switchD_00125729_caseD_2;
    case LY_IDENT_TYPE:
      if (module == (lys_module *)0x0) {
        __assert_fail("module",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
                      ,0x909,
                      "int lyp_check_identifier(struct ly_ctx *, const char *, enum LY_IDENT, struct lys_module *, struct lys_node *)"
                     );
      }
      plVar10 = lys_main_module(module);
      iVar7 = strcmp(id,"binary");
      if (((((iVar7 != 0) && (iVar7 = strcmp(id,"bits"), iVar7 != 0)) &&
           (iVar7 = strcmp(id,"boolean"), iVar7 != 0)) &&
          ((iVar7 = strcmp(id,"decimal64"), iVar7 != 0 && (iVar7 = strcmp(id,"empty"), iVar7 != 0)))
          ) && (((((iVar7 = strcmp(id,"enumeration"), iVar7 != 0 &&
                   ((iVar7 = strcmp(id,"identityref"), iVar7 != 0 &&
                    (iVar7 = strcmp(id,"instance-identifier"), iVar7 != 0)))) &&
                  (iVar7 = strcmp(id,"int8"), iVar7 != 0)) &&
                 ((((iVar7 = strcmp(id,"int16"), iVar7 != 0 &&
                    (iVar7 = strcmp(id,"int32"), iVar7 != 0)) &&
                   (iVar7 = strcmp(id,"int64"), iVar7 != 0)) &&
                  (((iVar7 = strcmp(id,"leafref"), iVar7 != 0 &&
                    (iVar7 = strcmp(id,"string"), iVar7 != 0)) &&
                   ((iVar7 = strcmp(id,"uint8"), iVar7 != 0 &&
                    ((iVar7 = strcmp(id,"uint16"), iVar7 != 0 &&
                     (iVar7 = strcmp(id,"uint32"), iVar7 != 0)))))))))) &&
                ((iVar7 = strcmp(id,"uint64"), iVar7 != 0 &&
                 (iVar7 = strcmp(id,"union"), iVar7 != 0)))))) {
        for (; parent != (lys_node *)0x0; parent = lys_parent(parent)) {
          LVar3 = parent->nodetype;
          if (LVar3 == LYS_GROUPING) {
            size = (uint)*(ushort *)(parent->padding + 2);
            lVar9 = 0x68;
LAB_001259b6:
            iVar7 = dup_typedef_check(id,*(lys_tpdf **)(parent->padding + lVar9 + -0x1c),size);
            if (iVar7 != 0) goto LAB_00125baf;
          }
          else {
            if (LVar3 == LYS_LIST) {
              size = (uint)parent->padding[1];
LAB_001259a6:
              lVar9 = 0x80;
              goto LAB_001259b6;
            }
            if (LVar3 == LYS_CONTAINER) {
              size = (uint)*(ushort *)(parent->padding + 2);
              goto LAB_001259a6;
            }
          }
        }
        iVar7 = dup_typedef_check(id,module->tpdf,(uint)module->tpdf_size);
        if (iVar7 == 0) {
          bVar2 = plVar10->inc_size;
          lVar9 = 0;
          do {
            if ((ulong)bVar2 * 0x30 + 0x30 == lVar9 + 0x30) {
              return 0;
            }
            lVar6 = *(long *)(plVar10->inc->rev + lVar9 + -8);
            if (lVar6 == 0) {
              return 0;
            }
            iVar7 = dup_typedef_check(id,*(lys_tpdf **)(lVar6 + 0x70),
                                      (uint)*(ushort *)(lVar6 + 0x4a));
            lVar9 = lVar9 + 0x30;
          } while (iVar7 == 0);
        }
LAB_00125baf:
        pcVar11 = "typedef";
        break;
      }
      ly_vlog(ctx,LYE_INARG,LY_VLOG_NONE,(void *)0x0,id,"typedef");
      ly_vlog(ctx,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Typedef name duplicates a built-in type.");
      goto LAB_00125b84;
    case LY_IDENT_NAME:
      if (parent == (lys_node *)0x0) {
        return 0;
      }
      pplVar13 = &parent->child;
      do {
        plVar4 = *pplVar13;
        if (plVar4 == (lys_node *)0x0) {
          return 0;
        }
        pplVar13 = &plVar4->next;
      } while (plVar4->name != id);
      pcVar12 = "name duplication";
      goto LAB_00125ac7;
    case LY_IDENT_PREFIX:
      if (module == (lys_module *)0x0) {
        __assert_fail("module",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
                      ,0x944,
                      "int lyp_check_identifier(struct ly_ctx *, const char *, enum LY_IDENT, struct lys_module *, struct lys_node *)"
                     );
      }
      if ((module->prefix == (char *)0x0) || (iVar7 = strcmp(module->prefix,id), iVar7 != 0)) {
        bVar2 = module->imp_size;
        lVar9 = 0;
        do {
          if ((ulong)bVar2 * 0x38 + 0x38 == lVar9 + 0x38) {
            return 0;
          }
          iVar7 = strcmp(*(char **)(module->imp->rev + lVar9 + -8),id);
          lVar9 = lVar9 + 0x38;
        } while (iVar7 != 0);
      }
      pcVar11 = "prefix";
      break;
    case LY_IDENT_EXTENSION:
      if (module == (lys_module *)0x0) {
        __assert_fail("module",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
                      ,0x961,
                      "int lyp_check_identifier(struct ly_ctx *, const char *, enum LY_IDENT, struct lys_module *, struct lys_node *)"
                     );
      }
      plVar10 = lys_main_module(module);
      lVar9 = 0;
      do {
        if ((ulong)plVar10->extensions_size * 0x40 + 0x40 == lVar9 + 0x40) {
          uVar8 = 0;
          do {
            if (uVar8 == plVar10->inc_size) {
              return 0;
            }
            plVar5 = plVar10->inc[uVar8].submodule;
            if (plVar5 == (lys_submodule *)0x0) {
              return 0;
            }
            lVar9 = 0;
            while ((ulong)plVar5->extensions_size * 0x40 + 0x40 != lVar9 + 0x40) {
              lVar6 = lVar9 + -0x1b;
              lVar9 = lVar9 + 0x40;
              if (*(char **)(plVar5->extensions->padding + lVar6) == id) {
                pcVar11 = "extension";
                goto LAB_00125b76;
              }
            }
            uVar8 = uVar8 + 1;
          } while( true );
        }
        lVar6 = lVar9 + -0x1b;
        lVar9 = lVar9 + 0x40;
      } while (*(char **)(plVar10->extensions->padding + lVar6) != id);
      pcVar11 = "extension";
    }
LAB_00125b76:
    ecode = LYE_DUPID;
  }
  else {
    pcVar12 = "invalid start character";
LAB_00125ac7:
    ecode = LYE_INID;
    pcVar11 = id;
    id = pcVar12;
  }
  ly_vlog(ctx,ecode,LY_VLOG_NONE,(void *)0x0,pcVar11,id);
LAB_00125b84:
  iVar7 = 1;
switchD_00125729_caseD_2:
  return iVar7;
}

Assistant:

int
lyp_check_identifier(struct ly_ctx *ctx, const char *id, enum LY_IDENT type, struct lys_module *module,
                     struct lys_node *parent)
{
    int i, j;
    int size;
    struct lys_tpdf *tpdf;
    struct lys_node *node;
    struct lys_module *mainmod;
    struct lys_submodule *submod;

    assert(ctx && id);

    /* check id syntax */
    if (!(id[0] >= 'A' && id[0] <= 'Z') && !(id[0] >= 'a' && id[0] <= 'z') && id[0] != '_') {
        LOGVAL(ctx, LYE_INID, LY_VLOG_NONE, NULL, id, "invalid start character");
        return EXIT_FAILURE;
    }
    for (i = 1; id[i]; i++) {
        if (!(id[i] >= 'A' && id[i] <= 'Z') && !(id[i] >= 'a' && id[i] <= 'z')
                && !(id[i] >= '0' && id[i] <= '9') && id[i] != '_' && id[i] != '-' && id[i] != '.') {
            LOGVAL(ctx, LYE_INID, LY_VLOG_NONE, NULL, id, "invalid character");
            return EXIT_FAILURE;
        }
    }

    if (i > 64) {
        LOGWRN(ctx, "Identifier \"%s\" is long, you should use something shorter.", id);
    }

    switch (type) {
    case LY_IDENT_NAME:
        /* check uniqueness of the node within its siblings */
        if (!parent) {
            break;
        }

        LY_TREE_FOR(parent->child, node) {
            if (ly_strequal(node->name, id, 1)) {
                LOGVAL(ctx, LYE_INID, LY_VLOG_NONE, NULL, id, "name duplication");
                return EXIT_FAILURE;
            }
        }
        break;
    case LY_IDENT_TYPE:
        assert(module);
        mainmod = lys_main_module(module);

        /* check collision with the built-in types */
        if (!strcmp(id, "binary") || !strcmp(id, "bits") ||
                !strcmp(id, "boolean") || !strcmp(id, "decimal64") ||
                !strcmp(id, "empty") || !strcmp(id, "enumeration") ||
                !strcmp(id, "identityref") || !strcmp(id, "instance-identifier") ||
                !strcmp(id, "int8") || !strcmp(id, "int16") ||
                !strcmp(id, "int32") || !strcmp(id, "int64") ||
                !strcmp(id, "leafref") || !strcmp(id, "string") ||
                !strcmp(id, "uint8") || !strcmp(id, "uint16") ||
                !strcmp(id, "uint32") || !strcmp(id, "uint64") || !strcmp(id, "union")) {
            LOGVAL(ctx, LYE_INARG, LY_VLOG_NONE, NULL, id, "typedef");
            LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Typedef name duplicates a built-in type.");
            return EXIT_FAILURE;
        }

        /* check locally scoped typedefs (avoid name shadowing) */
        for (; parent; parent = lys_parent(parent)) {
            switch (parent->nodetype) {
            case LYS_CONTAINER:
                size = ((struct lys_node_container *)parent)->tpdf_size;
                tpdf = ((struct lys_node_container *)parent)->tpdf;
                break;
            case LYS_LIST:
                size = ((struct lys_node_list *)parent)->tpdf_size;
                tpdf = ((struct lys_node_list *)parent)->tpdf;
                break;
            case LYS_GROUPING:
                size = ((struct lys_node_grp *)parent)->tpdf_size;
                tpdf = ((struct lys_node_grp *)parent)->tpdf;
                break;
            default:
                continue;
            }

            if (dup_typedef_check(id, tpdf, size)) {
                LOGVAL(ctx, LYE_DUPID, LY_VLOG_NONE, NULL, "typedef", id);
                return EXIT_FAILURE;
            }
        }

        /* check top-level names */
        if (dup_typedef_check(id, module->tpdf, module->tpdf_size)) {
            LOGVAL(ctx, LYE_DUPID, LY_VLOG_NONE, NULL, "typedef", id);
            return EXIT_FAILURE;
        }

        /* check submodule's top-level names */
        for (i = 0; i < mainmod->inc_size && mainmod->inc[i].submodule; i++) {
            if (dup_typedef_check(id, mainmod->inc[i].submodule->tpdf, mainmod->inc[i].submodule->tpdf_size)) {
                LOGVAL(ctx, LYE_DUPID, LY_VLOG_NONE, NULL, "typedef", id);
                return EXIT_FAILURE;
            }
        }

        break;
    case LY_IDENT_PREFIX:
        assert(module);

        /* check the module itself */
        if (dup_prefix_check(id, module)) {
            LOGVAL(ctx, LYE_DUPID, LY_VLOG_NONE, NULL, "prefix", id);
            return EXIT_FAILURE;
        }
        break;
    case LY_IDENT_FEATURE:
        assert(module);
        mainmod = lys_main_module(module);

        /* check feature name uniqueness*/
        /* check features in the current module */
        if (dup_feature_check(id, module)) {
            LOGVAL(ctx, LYE_DUPID, LY_VLOG_NONE, NULL, "feature", id);
            return EXIT_FAILURE;
        }

        /* and all its submodules */
        for (i = 0; i < mainmod->inc_size && mainmod->inc[i].submodule; i++) {
            if (dup_feature_check(id, (struct lys_module *)mainmod->inc[i].submodule)) {
                LOGVAL(ctx, LYE_DUPID, LY_VLOG_NONE, NULL, "feature", id);
                return EXIT_FAILURE;
            }
        }
        break;

    case LY_IDENT_EXTENSION:
        assert(module);
        mainmod = lys_main_module(module);

        /* check extension name uniqueness in the main module ... */
        for (i = 0; i < mainmod->extensions_size; i++) {
            if (ly_strequal(id, mainmod->extensions[i].name, 1)) {
                LOGVAL(ctx, LYE_DUPID, LY_VLOG_NONE, NULL, "extension", id);
                return EXIT_FAILURE;
            }
        }

        /* ... and all its submodules */
        for (j = 0; j < mainmod->inc_size && mainmod->inc[j].submodule; j++) {
            submod = mainmod->inc[j].submodule; /* shortcut */
            for (i = 0; i < submod->extensions_size; i++) {
                if (ly_strequal(id, submod->extensions[i].name, 1)) {
                    LOGVAL(ctx, LYE_DUPID, LY_VLOG_NONE, NULL, "extension", id);
                    return EXIT_FAILURE;
                }
            }
        }

        break;

    default:
        /* no check required */
        break;
    }

    return EXIT_SUCCESS;
}